

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> __thiscall
kj::anon_unknown_36::WebSocketImpl::sendCloseDueToError
          (WebSocketImpl *this,uint16_t code,StringPtr reason)

{
  SourceLocation location;
  StringPtr reason_00;
  uint16_t code_00;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *other;
  undefined6 in_register_00000032;
  size_t in_R8;
  WebSocketImpl *this_00;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> local_88;
  char *local_78;
  size_t sStack_70;
  SourceLocation local_60;
  undefined1 local_48 [8];
  PromiseFulfillerPair<void> paf;
  uint16_t code_local;
  WebSocketImpl *this_local;
  StringPtr reason_local;
  
  paf.fulfiller.ptr._6_2_ = (uint16_t)reason.content.ptr;
  this_00 = this;
  SourceLocation::SourceLocation
            (&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"sendCloseDueToError",0xe21,0x10);
  location.function = (char *)local_60._16_8_;
  location.fileName = local_60.function;
  location._16_8_ = this_00;
  newPromiseAndFulfiller<void>(location);
  code_00 = paf.fulfiller.ptr._6_2_;
  local_78 = (char *)reason.content.size_;
  sStack_70 = in_R8;
  other = mv<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>
                    ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&paf);
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::Own(&local_88,other);
  reason_00.content.size_ = sStack_70;
  reason_00.content.ptr = local_78;
  queueClose((WebSocketImpl *)CONCAT62(in_register_00000032,code),code_00,reason_00,&local_88);
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::~Own(&local_88);
  Promise<void>::
  then<kj::(anonymous_namespace)::WebSocketImpl::sendCloseDueToError(unsigned_short,kj::StringPtr)::_lambda()_1_>
            ((Promise<void> *)this_00,(Type *)local_48);
  PromiseFulfillerPair<void>::~PromiseFulfillerPair((PromiseFulfillerPair<void> *)local_48);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<Message> sendCloseDueToError(uint16_t code, kj::StringPtr reason){
    auto paf = newPromiseAndFulfiller<void>();
    queueClose(code, reason, kj::mv(paf.fulfiller));

    return paf.promise.then([this, code, reason]() -> kj::Promise<Message> {
        return errorHandler.handleWebSocketProtocolError({
            code, reason
          });
      });
  }